

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfs.cpp
# Opt level: O0

void handlegraph::algorithms::internal::dfs
               (HandleGraph *graph,function<void_(const_handlegraph::handle_t_&)> *handle_begin_fn,
               function<void_(const_handlegraph::handle_t_&)> *handle_end_fn,
               vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *sources,
               unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
               *sinks)

{
  function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *in_RCX;
  function<bool_()> *in_RDX;
  HandleGraph *unaff_RBX;
  function<void_(const_handlegraph::handle_t_&)> *in_RSI;
  function<void_(const_handlegraph::handle_t_&)> *in_RDI;
  function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *in_R8;
  function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *unaff_retaddr;
  function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>
  *in_stack_00000008;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_00000010;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *in_stack_00000018;
  anon_class_1_0_00000001 edge_noop;
  anon_class_1_0_00000001 *in_stack_fffffffffffffea8;
  function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>
  *in_stack_fffffffffffffeb0;
  
  std::function<bool()>::
  function<handlegraph::algorithms::internal::dfs(handlegraph::HandleGraph_const&,std::function<void(handlegraph::handle_t_const&)>const&,std::function<void(handlegraph::handle_t_const&)>const&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&,std::unordered_set<handlegraph::handle_t,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<handlegraph::handle_t>>const&)::__0,void>
            ((function<bool_()> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::function<void(std::pair<handlegraph::handle_t,handlegraph::handle_t>const&)>::
  function<handlegraph::algorithms::internal::dfs(handlegraph::HandleGraph_const&,std::function<void(handlegraph::handle_t_const&)>const&,std::function<void(handlegraph::handle_t_const&)>const&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&,std::unordered_set<handlegraph::handle_t,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<handlegraph::handle_t>>const&)::__1&,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::function<void(std::pair<handlegraph::handle_t,handlegraph::handle_t>const&)>::
  function<handlegraph::algorithms::internal::dfs(handlegraph::HandleGraph_const&,std::function<void(handlegraph::handle_t_const&)>const&,std::function<void(handlegraph::handle_t_const&)>const&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&,std::unordered_set<handlegraph::handle_t,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<handlegraph::handle_t>>const&)::__1&,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::function<void(std::pair<handlegraph::handle_t,handlegraph::handle_t>const&)>::
  function<handlegraph::algorithms::internal::dfs(handlegraph::HandleGraph_const&,std::function<void(handlegraph::handle_t_const&)>const&,std::function<void(handlegraph::handle_t_const&)>const&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&,std::unordered_set<handlegraph::handle_t,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<handlegraph::handle_t>>const&)::__1&,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::function<void(std::pair<handlegraph::handle_t,handlegraph::handle_t>const&)>::
  function<handlegraph::algorithms::internal::dfs(handlegraph::HandleGraph_const&,std::function<void(handlegraph::handle_t_const&)>const&,std::function<void(handlegraph::handle_t_const&)>const&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&,std::unordered_set<handlegraph::handle_t,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<handlegraph::handle_t>>const&)::__1&,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  dfs(unaff_RBX,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_retaddr,in_stack_00000008,in_stack_00000010,
      in_stack_00000018);
  std::function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>::~function
            ((function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)
             0x203c35);
  std::function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>::~function
            ((function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)
             0x203c42);
  std::function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>::~function
            ((function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)
             0x203c4f);
  std::function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)>::~function
            ((function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)
             0x203c5c);
  std::function<bool_()>::~function((function<bool_()> *)0x203c69);
  return;
}

Assistant:

void dfs(const HandleGraph& graph,
         const function<void(const handle_t&)>& handle_begin_fn,
         const function<void(const handle_t&)>& handle_end_fn,
         const vector<handle_t>& sources,
         const unordered_set<handle_t>& sinks) {
    auto edge_noop = [](const edge_t& e) { };
    dfs(graph,
        handle_begin_fn,
        handle_end_fn,
        [](void) { return false; },
        edge_noop,
        edge_noop,
        edge_noop,
        edge_noop,
        sources,
        sinks);
}